

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::texture_size_invalid_sampler
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  DataType dataType;
  string shaderSource_00;
  bool bVar1;
  ContextType CVar2;
  char *pcVar3;
  long *plVar4;
  size_t sVar5;
  ostream *poVar6;
  ShaderType shaderType_00;
  size_type *psVar7;
  DataType dataType_00;
  DataType dataType_01;
  long lVar8;
  uint uVar9;
  string shaderSource;
  ostringstream source;
  _Alloc_hider in_stack_fffffffffffffd28;
  size_type in_stack_fffffffffffffd30;
  undefined8 in_stack_fffffffffffffd38;
  undefined8 in_stack_fffffffffffffd40;
  string local_2b0;
  long *local_290 [2];
  long local_280 [2];
  long *local_270;
  long local_268;
  long local_260 [2];
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  long local_1d0;
  string local_1c8;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,
             "textureSize: Invalid sampler type - some overloads take two arguments while others take only one."
             ,"");
  NegativeTestContext::beginSection(ctx,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  lVar8 = 0;
  do {
    shaderType = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar8];
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      pcVar3 = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xfffffffffffffd28,pcVar3,(allocator<char> *)&local_1f0);
      plVar4 = (long *)std::__cxx11::string::replace
                                 ((ulong)&stack0xfffffffffffffd28,0,(char *)0x0,0x1c82f43);
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_1a8[0].field_2._0_8_ = *psVar7;
        local_1a8[0].field_2._8_8_ = plVar4[3];
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
      }
      else {
        local_1a8[0].field_2._0_8_ = *psVar7;
        local_1a8[0]._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_1a8[0]._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      NegativeTestContext::beginSection(ctx,local_1a8);
      local_1d0 = lVar8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if (in_stack_fffffffffffffd28._M_p != &stack0xfffffffffffffd38) {
        operator_delete(in_stack_fffffffffffffd28._M_p,in_stack_fffffffffffffd38 + 1);
      }
      lVar8 = 0;
      do {
        CVar2.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
        bVar1 = glu::contextSupports(CVar2,(ApiType)0x23);
        dataType = *(DataType *)
                    ((long)&NegativeTestShared::(anonymous_namespace)::s_samplerTypes + lVar8);
        if (bVar1) {
LAB_015fa513:
          pcVar3 = glu::getDataTypeName(dataType);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&stack0xfffffffffffffd28,pcVar3,(allocator<char> *)&local_1f0);
          plVar4 = (long *)std::__cxx11::string::replace
                                     ((ulong)&stack0xfffffffffffffd28,0,(char *)0x0,0x1c84e5f);
          psVar7 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar7) {
            local_1a8[0].field_2._0_8_ = *psVar7;
            local_1a8[0].field_2._8_8_ = plVar4[3];
            local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
          }
          else {
            local_1a8[0].field_2._0_8_ = *psVar7;
            local_1a8[0]._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_1a8[0]._M_string_length = plVar4[1];
          *plVar4 = (long)psVar7;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          NegativeTestContext::beginSection(ctx,local_1a8);
          shaderType_00 = (ShaderType)psVar7;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
            operator_delete(local_1a8[0]._M_dataplus._M_p,
                            local_1a8[0].field_2._M_allocated_capacity + 1);
          }
          if (in_stack_fffffffffffffd28._M_p != &stack0xfffffffffffffd38) {
            operator_delete(in_stack_fffffffffffffd28._M_p,in_stack_fffffffffffffd38 + 1);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          CVar2.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
          bVar1 = glu::contextSupports(CVar2,(ApiType)0x23);
          pcVar3 = glu::getGLSLVersionDeclaration(bVar1 | GLSL_VERSION_310_ES);
          if (pcVar3 == (char *)0x0) {
            std::ios::clear((int)&stack0xfffffffffffffd28 +
                            (int)*(undefined8 *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 0x130);
          }
          else {
            sVar5 = strlen(pcVar3);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar3,sVar5);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
          NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_1f0,(_anonymous_namespace_ *)(ulong)dataType,dataType_01);
          getShaderExtensionDeclaration((string *)&stack0xfffffffffffffd28,&local_1f0);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,in_stack_fffffffffffffd28._M_p,
                              in_stack_fffffffffffffd30);
          NegativeTestShared::(anonymous_namespace)::getShaderInitialization_abi_cxx11_
                    (&local_210,(_anonymous_namespace_ *)ctx,
                     (NegativeTestContext *)(ulong)shaderType,shaderType_00);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_210._M_dataplus._M_p,local_210._M_string_length);
          local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
          local_2b0.field_2._M_allocated_capacity._0_4_ = 0x706d6173;
          local_2b0._M_string_length = 7;
          local_2b0.field_2._M_allocated_capacity._4_4_ = 0x72656c;
          declareShaderUniform(&local_230,dataType,&local_2b0);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_230._M_dataplus._M_p,local_230._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"void main(void)\n",0x10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"{\n",2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
            operator_delete(local_2b0._M_dataplus._M_p,
                            CONCAT44(local_2b0.field_2._M_allocated_capacity._4_4_,
                                     local_2b0.field_2._M_allocated_capacity._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
          }
          if (in_stack_fffffffffffffd28._M_p != &stack0xfffffffffffffd38) {
            operator_delete(in_stack_fffffffffffffd28._M_p,in_stack_fffffffffffffd38 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
          }
          uVar9 = dataType - TYPE_SAMPLER_2D;
          if (uVar9 < 0x33) {
            if ((0x3b76dbbUL >> ((ulong)uVar9 & 0x3f) & 1) == 0) {
              if ((0x7e0001c000000U >> ((ulong)uVar9 & 0x3f) & 1) != 0) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"    ",4);
                local_250.field_2._M_local_buf[2] = 'd';
                local_250.field_2._M_allocated_capacity._0_2_ = 0x6f6c;
                local_250._M_string_length = 3;
                local_250.field_2._M_local_buf[3] = '\0';
                local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
                declareAndInitializeShaderVariable
                          ((string *)&stack0xfffffffffffffd28,TYPE_INT,&local_250);
                poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1a8,in_stack_fffffffffffffd28._M_p,
                                    in_stack_fffffffffffffd30);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar6,"    textureSize(sampler, lod);\n",0x1f);
                if (in_stack_fffffffffffffd28._M_p != &stack0xfffffffffffffd38) {
                  operator_delete(in_stack_fffffffffffffd28._M_p,in_stack_fffffffffffffd38 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_250._M_dataplus._M_p != &local_250.field_2) {
                  operator_delete(local_250._M_dataplus._M_p,
                                  CONCAT44(local_250.field_2._M_allocated_capacity._4_4_,
                                           CONCAT13(local_250.field_2._M_local_buf[3],
                                                    CONCAT12(local_250.field_2._M_local_buf[2],
                                                             local_250.field_2._M_allocated_capacity
                                                             ._0_2_))) + 1);
                }
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"    textureSize(sampler);\n",0x1a);
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
          std::__cxx11::stringbuf::str();
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          local_290[0] = local_280;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_290,local_270,local_268 + (long)local_270);
          shaderSource_00._M_string_length = in_stack_fffffffffffffd30;
          shaderSource_00._M_dataplus._M_p = in_stack_fffffffffffffd28._M_p;
          shaderSource_00.field_2._M_allocated_capacity = in_stack_fffffffffffffd38;
          shaderSource_00.field_2._8_8_ = in_stack_fffffffffffffd40;
          verifyShader((anon_unknown_0 *)ctx,(NegativeTestContext *)(ulong)shaderType,
                       (ShaderType)local_290[0],shaderSource_00);
          if (local_290[0] != local_280) {
            operator_delete(local_290[0],local_280[0] + 1);
          }
          NegativeTestContext::endSection(ctx);
          if (local_270 != local_260) {
            operator_delete(local_270,local_260[0] + 1);
          }
        }
        else {
          NegativeTestShared::(anonymous_namespace)::getDataTypeExtension_abi_cxx11_
                    (&local_1c8,(_anonymous_namespace_ *)(ulong)dataType,dataType_00);
          bVar1 = NegativeTestContext::isExtensionSupported(ctx,&local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          if (bVar1) goto LAB_015fa513;
        }
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0x70);
      NegativeTestContext::endSection(ctx);
      lVar8 = local_1d0;
    }
    lVar8 = lVar8 + 1;
    if (lVar8 == 6) {
      NegativeTestContext::endSection(ctx);
      return;
    }
  } while( true );
}

Assistant:

void texture_size_invalid_sampler (NegativeTestContext& ctx)
{
	ctx.beginSection("textureSize: Invalid sampler type - some overloads take two arguments while others take only one.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_samplerTypes); ++dataTypeNdx)
			{
				if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) || ctx.isExtensionSupported(getDataTypeExtension(s_samplerTypes[dataTypeNdx])))
				{
					ctx.beginSection("Verify sampler data type: " + std::string(getDataTypeName(s_samplerTypes[dataTypeNdx])));
					const std::string shaderSource(genShaderSourceTextureSize_sampler(ctx, s_shaders[shaderNdx], s_samplerTypes[dataTypeNdx], glu::TYPE_INT));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					ctx.endSection();
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}